

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O3

int __thiscall CmdLineArgsParser::Parse(CmdLineArgsParser *this,int argc,LPWSTR *argv)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = 0;
  if (1 < argc) {
    uVar2 = 1;
    do {
      iVar1 = Parse(this,argv[uVar2]);
      if (iVar1 != 0) {
        iVar1 = -1;
        break;
      }
      uVar2 = uVar2 + 1;
      iVar1 = 0;
    } while ((uint)argc != uVar2);
  }
  if ((this->flagTable->Filename).pszValue == (char16 *)0x0) {
    Js::String::Set(&this->flagTable->Filename,L"ttdSentinal.js");
  }
  return iVar1;
}

Assistant:

int
CmdLineArgsParser::Parse(int argc, __in_ecount(argc) LPWSTR argv[])
{
    int err = 0;

    for(int i = 1; i < argc; i++)
    {
        if ((err = Parse(argv[i])) != 0)
        {
            break;
        }
    }

    if(this->flagTable.Filename == nullptr)
    {
        this->flagTable.Filename = _u("ttdSentinal.js");
    }

    return err;
}